

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O2

void __thiscall DFsScript::DFsScript(DFsScript *this)

{
  long lVar1;
  
  DObject::DObject(&this->super_DObject);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_007ea110;
  for (lVar1 = 7; lVar1 != 0x18; lVar1 = lVar1 + 1) {
    this->sections[lVar1 + -7].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1)0x0;
  }
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    this->variables[lVar1].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)0x0;
  }
  for (lVar1 = 0x29; lVar1 != 0x12a; lVar1 = lVar1 + 1) {
    this->sections[lVar1 + -7].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1)0x0;
  }
  this->data = (char *)0x0;
  this->scriptnum = -1;
  this->len = 0;
  (this->parent).field_0.p = (DFsScript *)0x0;
  (this->trigger).field_0.p = (AActor *)0x0;
  this->lastiftrue = false;
  return;
}

Assistant:

DFsScript::DFsScript()
{
	int i;
	
	for(i=0; i<SECTIONSLOTS; i++) sections[i] = NULL;
	for(i=0; i<VARIABLESLOTS; i++) variables[i] = NULL;
	for(i=0; i<MAXSCRIPTS; i++)	children[i] = NULL;

	data = NULL;
	scriptnum = -1;
	len = 0;
	parent = NULL;
	trigger = NULL;
	lastiftrue = false;
}